

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosStream.cpp
# Opt level: O2

void __thiscall adiosStream::defineADIOSArray(adiosStream *this,shared_ptr<VariableInfo> *ov)

{
  element_type *peVar1;
  bool bVar2;
  
  bVar2 = std::operator==(&((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->type,"double");
  if (bVar2) {
    peVar1 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    adios2::IO::DefineVariable<double>
              ((string *)&this->io,(vector *)peVar1,(vector *)&peVar1->shape,
               (vector *)&peVar1->start,(bool)((char)peVar1 + -0x68));
    return;
  }
  bVar2 = std::operator==(&((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->type,"float");
  if (bVar2) {
    peVar1 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    adios2::IO::DefineVariable<float>
              ((string *)&this->io,(vector *)peVar1,(vector *)&peVar1->shape,
               (vector *)&peVar1->start,(bool)((char)peVar1 + -0x68));
    return;
  }
  bVar2 = std::operator==(&((ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->type,"int");
  if (bVar2) {
    peVar1 = (ov->super___shared_ptr<VariableInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    adios2::IO::DefineVariable<int>
              ((string *)&this->io,(vector *)peVar1,(vector *)&peVar1->shape,
               (vector *)&peVar1->start,(bool)((char)peVar1 + -0x68));
    return;
  }
  return;
}

Assistant:

void adiosStream::defineADIOSArray(const std::shared_ptr<VariableInfo> ov)
{
    if (ov->type == "double")
    {
        adios2::Variable<double> v =
            io.DefineVariable<double>(ov->name, ov->shape, ov->start, ov->count, true);
        (void)v;
        // v = io->InquireVariable<double>(ov->name);
    }
    else if (ov->type == "float")
    {
        adios2::Variable<float> v =
            io.DefineVariable<float>(ov->name, ov->shape, ov->start, ov->count, true);
        (void)v;
    }
    else if (ov->type == "int")
    {
        adios2::Variable<int> v =
            io.DefineVariable<int>(ov->name, ov->shape, ov->start, ov->count, true);
        (void)v;
    }
}